

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O1

bool __thiscall
Typelib::ValueVisitor::TypeDispatch::integer_cast<signed_char,short,int,long>
          (TypeDispatch *this,uint8_t *value,Type *t)

{
  int iVar1;
  size_t sVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  UnsupportedType *this_00;
  ValueVisitor *pVVar3;
  string local_40;
  
  sVar2 = Type::getSize(t);
  switch(sVar2) {
  case 1:
    pVVar3 = this->m_visitor;
    UNRECOVERED_JUMPTABLE = *pVVar3->_vptr_ValueVisitor;
    break;
  case 2:
    pVVar3 = this->m_visitor;
    UNRECOVERED_JUMPTABLE = pVVar3->_vptr_ValueVisitor[2];
    break;
  default:
    this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"unsupported integer size","");
    UnsupportedType::UnsupportedType(this_00,t,&local_40);
    __cxa_throw(this_00,&UnsupportedType::typeinfo,UnsupportedType::~UnsupportedType);
  case 4:
    pVVar3 = this->m_visitor;
    UNRECOVERED_JUMPTABLE = pVVar3->_vptr_ValueVisitor[4];
    break;
  case 8:
    pVVar3 = this->m_visitor;
    UNRECOVERED_JUMPTABLE = pVVar3->_vptr_ValueVisitor[6];
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pVVar3,value);
  return SUB41(iVar1,0);
}

Assistant:

bool integer_cast(uint8_t* value, Type const& t)
        {
            switch(t.getSize())
            {
                case 1: return m_visitor.visit_(*reinterpret_cast<T8*>(value));
                case 2: return m_visitor.visit_(*reinterpret_cast<T16*>(value));
                case 4: return m_visitor.visit_(*reinterpret_cast<T32*>(value));
                case 8: return m_visitor.visit_(*reinterpret_cast<T64*>(value));
                default:
                         throw UnsupportedType(t, "unsupported integer size");
            };
        }